

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-opcnt.cc
# Opt level: O2

Result __thiscall wabt::anon_unknown_31::BinaryReaderOpcnt::OnEndFunc(BinaryReaderOpcnt *this)

{
  Result RVar1;
  Kind local_8;
  undefined1 local_4 [4];
  
  _local_8 = 0xb00000000;
  RVar1 = (anonymous_namespace)::BinaryReaderOpcnt::
          Emplace<wabt::Opcode::Enum,wabt::OpcodeInfo::Kind>
                    ((BinaryReaderOpcnt *)this,(Enum *)local_4,&local_8);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderOpcnt::OnEndFunc() {
  return Emplace(Opcode::End, OpcodeInfo::Kind::Bare);
}